

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O1

void FT_List_Finalize(FT_List list,FT_List_Destructor destroy,FT_Memory memory,void *user)

{
  FT_ListNode pFVar1;
  FT_ListNode pFVar2;
  
  if (memory != (FT_Memory)0x0 && list != (FT_List)0x0) {
    pFVar2 = list->head;
    while (pFVar2 != (FT_ListNode)0x0) {
      pFVar1 = pFVar2->next;
      if (destroy != (FT_List_Destructor)0x0) {
        (*destroy)(memory,pFVar2->data,user);
      }
      (*memory->free)(memory,pFVar2);
      pFVar2 = pFVar1;
    }
    list->head = (FT_ListNode)0x0;
    list->tail = (FT_ListNode)0x0;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Finalize( FT_List             list,
                    FT_List_Destructor  destroy,
                    FT_Memory           memory,
                    void*               user )
  {
    FT_ListNode  cur;


    if ( !list || !memory )
      return;

    cur = list->head;
    while ( cur )
    {
      FT_ListNode  next = cur->next;
      void*        data = cur->data;


      if ( destroy )
        destroy( memory, data, user );

      FT_FREE( cur );
      cur = next;
    }

    list->head = NULL;
    list->tail = NULL;
  }